

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon.c
# Opt level: O0

void JPCommon_clear(JPCommon *jpcommon)

{
  long lVar1;
  long *in_RDI;
  JPCommonNode *node;
  JPCommonLabel *in_stack_00000040;
  
  while (*in_RDI != 0) {
    lVar1 = *(long *)(*in_RDI + 0x30);
    JPCommonNode_clear((JPCommonNode *)0x187272);
    free((void *)*in_RDI);
    *in_RDI = lVar1;
  }
  in_RDI[1] = 0;
  if (in_RDI[2] != 0) {
    JPCommonLabel_clear(in_stack_00000040);
    free((void *)in_RDI[2]);
  }
  in_RDI[2] = 0;
  return;
}

Assistant:

void JPCommon_clear(JPCommon * jpcommon)
{
   JPCommonNode *node;

   while (jpcommon->head != NULL) {
      node = jpcommon->head->next;
      JPCommonNode_clear(jpcommon->head);
      free(jpcommon->head);
      jpcommon->head = node;
   }
   jpcommon->tail = NULL;

   if (jpcommon->label != NULL) {
      JPCommonLabel_clear(jpcommon->label);
      free(jpcommon->label);
   }
   jpcommon->label = NULL;
}